

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

vector<field::GF2E,_std::allocator<field::GF2E>_> *
field::build_from_roots(vector<field::GF2E,_std::allocator<field::GF2E>_> *roots)

{
  reference pvVar1;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RSI;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  size_t i;
  size_t k;
  GF2E tmp;
  size_t len;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *poly;
  GF2E in_stack_ffffffffffffff68;
  GF2E in_stack_ffffffffffffff70;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *pvVar2;
  GF2E local_70;
  uint64_t local_68;
  uint64_t local_60;
  size_type local_58;
  uint64_t local_50;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_stack_ffffffffffffffb8;
  ulong __n;
  GF2E in_stack_ffffffffffffffc0;
  GF2E local_28;
  undefined1 local_19;
  size_type local_18;
  
  pvVar2 = in_RDI;
  local_18 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RSI);
  local_19 = 0;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            ((vector<field::GF2E,_std::allocator<field::GF2E>_> *)in_stack_ffffffffffffffc0.data,
             in_stack_ffffffffffffffb8);
  GF2E::GF2E(&local_28,0);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::push_back
            ((vector<field::GF2E,_std::allocator<field::GF2E>_> *)in_stack_ffffffffffffff70.data,
             (value_type *)in_stack_ffffffffffffff68.data);
  GF2E::GF2E((GF2E *)&stack0xffffffffffffffc0);
  for (__n = 1; __n < local_18; __n = __n + 1) {
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,__n);
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,__n - 1);
    local_50 = (uint64_t)GF2E::operator+(in_stack_ffffffffffffff68.data,(GF2E *)0x12e92f);
    pvVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,__n);
    pvVar1->data = local_50;
    local_58 = __n;
    while (local_58 = local_58 - 1, local_58 != 0) {
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,local_58);
      in_stack_ffffffffffffff70 = GF2E::operator*(in_stack_ffffffffffffff68.data,(GF2E *)0x12e98d);
      local_68 = in_stack_ffffffffffffff70.data;
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,local_58 - 1);
      in_stack_ffffffffffffff68 = GF2E::operator+(in_stack_ffffffffffffff68.data,(GF2E *)0x12e9bd);
      local_60 = in_stack_ffffffffffffff68.data;
      pvVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,local_58);
      pvVar1->data = local_60;
    }
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,0);
    GF2E::operator*=((GF2E *)in_stack_ffffffffffffff70.data,(GF2E *)in_stack_ffffffffffffff68.data);
  }
  GF2E::GF2E(&local_70,1);
  pvVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,local_18);
  pvVar1->data = local_70.data;
  return pvVar2;
}

Assistant:

std::vector<GF2E> build_from_roots(const std::vector<GF2E> &roots) {
  size_t len = roots.size();

  std::vector<GF2E> poly(roots);
  poly.push_back(GF2E(0));

  GF2E tmp;
  for (size_t k = 1; k < len; k++) {
    tmp = poly[k];
    poly[k] = tmp + poly[k - 1];
    for (size_t i = k - 1; i >= 1; i--) {
      poly[i] = poly[i] * tmp + poly[i - 1];
    }
    poly[0] *= tmp;
  }
  poly[len] = GF2E(1);
  return poly;
}